

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int mem_openmem(void **buffptr,size_t *buffsize,size_t deltasize,
               _func_void_ptr_void_ptr_size_t *memrealloc,int *handle)

{
  long lVar1;
  memdriver *pmVar2;
  
  *handle = -1;
  pmVar2 = memTable;
  lVar1 = 0;
  do {
    if (pmVar2->memaddrptr == (char **)0x0) {
      *handle = (int)lVar1;
      goto LAB_001116c9;
    }
    lVar1 = lVar1 + 1;
    pmVar2 = pmVar2 + 1;
  } while (lVar1 != 10000);
  lVar1 = 10000;
LAB_001116c9:
  if (*handle != -1) {
    memTable[lVar1].memaddrptr = (char **)buffptr;
    memTable[lVar1].memsizeptr = buffsize;
    memTable[lVar1].deltasize = deltasize;
    memTable[lVar1].fitsfilesize = *buffsize;
    memTable[lVar1].currentpos = 0;
    memTable[lVar1].mem_realloc = memrealloc;
    return 0;
  }
  return 0x67;
}

Assistant:

int mem_openmem(void **buffptr,   /* I - address of memory pointer          */
                size_t *buffsize, /* I - size of buffer, in bytes           */
                size_t deltasize, /* I - increment for future realloc's     */
                void *(*memrealloc)(void *p, size_t newsize),  /* function  */
                int *handle)
/* 
  lowest level routine to open a pre-existing memory file.
*/
{
    int ii;

    *handle = -1;
    for (ii = 0; ii < NMAXFILES; ii++)  /* find empty slot in handle table */
    {
        if (memTable[ii].memaddrptr == 0)
        {
            *handle = ii;
            break;
        }
    }
    if (*handle == -1)
       return(TOO_MANY_FILES);    /* too many files opened */

    memTable[ii].memaddrptr = (char **) buffptr; /* pointer to start addres */
    memTable[ii].memsizeptr = buffsize;     /* allocated size of memory */
    memTable[ii].deltasize = deltasize;     /* suggested realloc increment */
    memTable[ii].fitsfilesize = *buffsize;  /* size of FITS file (upper limit) */
    memTable[ii].currentpos = 0;            /* at beginning of the file */
    memTable[ii].mem_realloc = memrealloc;  /* memory realloc function */
    return(0);
}